

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

upb_MessageValue upb_MapIterator_Key(upb_Map *map,size_t iter)

{
  upb_StringView uVar1;
  upb_strtable_iter i;
  upb_MessageValue ret;
  upb_strtable_iter local_28;
  upb_StringView local_18;
  
  local_28.t = &map->table;
  local_28.index = iter;
  uVar1 = upb_strtable_iter_key(&local_28);
  if ((long)map->key_size != 0) {
    memcpy(&local_18,uVar1.data,(long)map->key_size);
    uVar1 = local_18;
  }
  return uVar1;
}

Assistant:

upb_MessageValue upb_MapIterator_Key(const upb_Map* map, size_t iter) {
  upb_strtable_iter i;
  upb_MessageValue ret;
  i.t = &map->table;
  i.index = iter;
  _upb_map_fromkey(upb_strtable_iter_key(&i), &ret, map->key_size);
  return ret;
}